

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnconditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,TokenList *args_2)

{
  Token directive;
  UnconditionalBranchDirectiveSyntax *this_00;
  TokenList *args_local_2;
  Token *args_local_1;
  SyntaxKind *args_local;
  BumpAllocator *this_local;
  
  this_00 = (UnconditionalBranchDirectiveSyntax *)allocate(this,0x50,8);
  directive.kind = args_1->kind;
  directive._2_1_ = args_1->field_0x2;
  directive.numFlags.raw = (args_1->numFlags).raw;
  directive.rawLen = args_1->rawLen;
  directive.info = args_1->info;
  slang::syntax::UnconditionalBranchDirectiveSyntax::UnconditionalBranchDirectiveSyntax
            (this_00,*args,directive,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }